

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::raw_problem,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
               raw_problem *p,
               vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *f)

{
  pointer pfVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  function_element *elem;
  pointer format_str;
  
  pfVar1 = (f->
           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (format_str = (f->
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    )._M_impl.super__Vector_impl_data._M_start; format_str != pfVar1;
      format_str = format_str + 1) {
    if (format_str->factor < 0) {
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[7],int_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)0x54c686,(char (*) [7])format_str,
                 (int *)((p->vars).names.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + format_str->variable_index),
                 in_R8);
    }
    else if (format_str->factor != 0) {
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[8],int_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)0x54c685,(char (*) [8])format_str,
                 (int *)((p->vars).names.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + format_str->variable_index),
                 in_R8);
    }
    fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[2],,true>
              ((buffer_appender<char>)
               (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (char (*) [2])0x549422);
  }
  return;
}

Assistant:

void
write_function_element(FormatContext& ctx, const Problem& p, const Function& f)
{
    for (auto& elem : f) {
        if (elem.factor < 0)
            fmt::format_to(ctx.out(),
                           " {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);
        else if (elem.factor > 0)
            fmt::format_to(ctx.out(),
                           "+ {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);

        fmt::format_to(ctx.out(), " ");
    }
}